

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O2

void __thiscall DPusher::Serialize(DPusher *this,FArchive *arc)

{
  FArchive *pFVar1;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = ::operator<<(arc,&this->m_Type);
  pFVar1 = ::operator<<(pFVar1,(AActor **)&this->m_Source);
  pFVar1 = ::operator<<(pFVar1,&this->m_PushVec);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Magnitude);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Radius);
  FArchive::operator<<(pFVar1,(DWORD *)&this->m_Affectee);
  return;
}

Assistant:

void DPusher::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << m_Type
		<< m_Source
		<< m_PushVec
		<< m_Magnitude
		<< m_Radius
		<< m_Affectee;
}